

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager_p.h
# Opt level: O0

void __thiscall
QNetworkAccessManagerPrivate::QNetworkAccessManagerPrivate(QNetworkAccessManagerPrivate *this)

{
  QHstsCache *in_RDI;
  long in_FS_OFFSET;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,QObjectPrivateVersion);
  *(undefined ***)&(in_RDI->knownHosts)._M_t._M_impl = &PTR__QNetworkAccessManagerPrivate_0049a200;
  *(undefined8 *)&in_RDI[2].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  in_RDI[2].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  in_RDI[2].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x1a1338);
  in_RDI[2].knownHosts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&in_RDI[2].hstsStore = 0;
  *(undefined1 *)((long)&in_RDI[2].hstsStore + 1) = 1;
  *(undefined4 *)((long)&in_RDI[2].hstsStore + 4) = 1;
  std::make_shared<QNetworkAccessAuthenticationManager>();
  QHstsCache::QHstsCache(in_RDI);
  QScopedPointer<QHstsStore,_QScopedPointerDeleter<QHstsStore>_>::QScopedPointer
            ((QScopedPointer<QHstsStore,_QScopedPointerDeleter<QHstsStore>_> *)
             &in_RDI[4].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (QHstsStore *)0x0);
  *(undefined1 *)&in_RDI[4].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 0;
  *(undefined1 *)
   ((long)&in_RDI[4].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) = 0;
  local_c = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)
             &in_RDI[4].knownHosts._M_t._M_impl.super__Rb_tree_header._M_header._M_right,&local_c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessManagerPrivate()
        : networkCache(nullptr),
          cookieJar(nullptr),
          thread(nullptr),
#ifndef QT_NO_NETWORKPROXY
          proxyFactory(nullptr),
#endif
          cookieJarCreated(false),
          defaultAccessControl(true),
          redirectPolicy(QNetworkRequest::NoLessSafeRedirectPolicy),
          authenticationManager(std::make_shared<QNetworkAccessAuthenticationManager>())
    {
    }